

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

pair<bool,_cmValue> __thiscall
anon_unknown.dwarf_1b25b3e::FileSetType::ReadProperties
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop)

{
  pointer __s1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  string *this_00;
  cmValue cVar4;
  string *extraout_RAX;
  size_type __rlen;
  string_view separator;
  string_view separator_00;
  pair<bool,_cmValue> pVar5;
  string fileSetName;
  string local_50;
  
  __s1 = (prop->_M_dataplus)._M_p;
  __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prop->_M_string_length;
  if ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->DefaultDirectoryProperty).super_string_view._M_len) &&
     ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0 ||
      (iVar2 = bcmp(__s1,(this->DefaultDirectoryProperty).super_string_view._M_str,(size_t)__n),
      iVar2 == 0)))) {
    pcVar1 = (this->TypeName).super_string_view._M_str;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pcVar1,pcVar1 + (this->TypeName).super_string_view._M_len);
    cVar4 = cmTargetInternals::GetFileSetDirectories
                      (impl,tgt,&local_50,(this->TypeName).super_string_view);
LAB_00454c04:
    this_00 = cVar4.Value;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00454c11:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      cVar4.Value = extraout_RAX;
    }
  }
  else {
    if ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(this->DefaultPathProperty).super_string_view._M_len) &&
       ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0 ||
        (iVar2 = bcmp(__s1,(this->DefaultPathProperty).super_string_view._M_str,(size_t)__n),
        iVar2 == 0)))) {
      pcVar1 = (this->TypeName).super_string_view._M_str;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,pcVar1 + (this->TypeName).super_string_view._M_len);
      cVar4 = cmTargetInternals::GetFileSetPaths
                        (impl,tgt,&local_50,(this->TypeName).super_string_view);
      goto LAB_00454c04;
    }
    if ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(this->SelfEntries).PropertyName.super_string_view._M_len) &&
       ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0 ||
        (iVar2 = bcmp(__s1,(this->SelfEntries).PropertyName.super_string_view._M_str,(size_t)__n),
        iVar2 == 0)))) {
      if ((anonymous_namespace)::FileSetType::
          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
          output_abi_cxx11_ == '\0') {
        (anonymous_namespace)::FileSetType::ReadProperties();
      }
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                (&local_50,&(this->SelfEntries).Entries,separator);
      this_00 = &(anonymous_namespace)::FileSetType::
                 ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                 ::output_abi_cxx11_;
LAB_00454ca4:
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    }
    else {
      if ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(this->InterfaceEntries).PropertyName.super_string_view._M_len) &&
         ((__n == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0 ||
          (iVar2 = bcmp(__s1,(this->InterfaceEntries).PropertyName.super_string_view._M_str,
                        (size_t)__n), iVar2 == 0)))) {
        if ((anonymous_namespace)::FileSetType::
            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          (anonymous_namespace)::FileSetType::ReadProperties();
        }
        separator_00._M_str = ";";
        separator_00._M_len = 1;
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_50,&(this->InterfaceEntries).Entries,separator_00);
        this_00 = &(anonymous_namespace)::FileSetType::
                   ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                   ::output_abi_cxx11_;
        goto LAB_00454ca4;
      }
      local_50._M_dataplus._M_p = (pointer)__n;
      local_50._M_string_length = (size_type)__s1;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,0,
                         (this->DirectoryPrefix).super_string_view._M_len,
                         (this->DirectoryPrefix).super_string_view);
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)prop);
        if ((pointer)local_50._M_string_length == (pointer)0x0) {
LAB_00454cf8:
          this_00 = (string *)0x0;
        }
        else {
          this_00 = (string *)
                    cmTargetInternals::GetFileSetDirectories
                              (impl,tgt,&local_50,(this->TypeName).super_string_view);
        }
      }
      else {
        local_50._M_string_length = (size_type)(prop->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)prop->_M_string_length;
        this_00 = (string *)0x0;
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,0,
                           (this->PathPrefix).super_string_view._M_len,
                           (this->PathPrefix).super_string_view);
        uVar3 = 0;
        if (iVar2 != 0) goto LAB_00454c20;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)prop);
        if ((pointer)local_50._M_string_length == (pointer)0x0) goto LAB_00454cf8;
        this_00 = (string *)
                  cmTargetInternals::GetFileSetPaths
                            (impl,tgt,&local_50,(this->TypeName).super_string_view);
      }
    }
    cVar4.Value = (string *)&local_50.field_2;
    if ((string *)local_50._M_dataplus._M_p != cVar4.Value) goto LAB_00454c11;
  }
  uVar3 = CONCAT71((int7)((ulong)cVar4.Value >> 8),1);
LAB_00454c20:
  pVar5.second.Value = this_00;
  pVar5._0_8_ = uVar3;
  return pVar5;
}

Assistant:

std::pair<bool, cmValue> FileSetType::ReadProperties(
  cmTarget const* tgt, cmTargetInternals const* impl,
  const std::string& prop) const
{
  bool did_read = false;
  cmValue value = nullptr;
  if (prop == this->DefaultDirectoryProperty) {
    value = impl->GetFileSetDirectories(tgt, std::string(this->TypeName),
                                        this->TypeName);
    did_read = true;
  } else if (prop == this->DefaultPathProperty) {
    value =
      impl->GetFileSetPaths(tgt, std::string(this->TypeName), this->TypeName);
    did_read = true;
  } else if (prop == this->SelfEntries.PropertyName) {
    static std::string output;
    output = cmJoin(this->SelfEntries.Entries, ";"_s);
    value = cmValue(output);
    did_read = true;
  } else if (prop == this->InterfaceEntries.PropertyName) {
    static std::string output;
    output = cmJoin(this->InterfaceEntries.Entries, ";"_s);
    value = cmValue(output);
    did_read = true;
  } else if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    std::string fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (!fileSetName.empty()) {
      value = impl->GetFileSetDirectories(tgt, fileSetName, this->TypeName);
    }
    did_read = true;
  } else if (cmHasPrefix(prop, this->PathPrefix)) {
    std::string fileSetName = prop.substr(this->PathPrefix.size());
    if (!fileSetName.empty()) {
      value = impl->GetFileSetPaths(tgt, fileSetName, this->TypeName);
    }
    did_read = true;
  }
  return { did_read, value };
}